

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

int compare(char *a,char *b)

{
  char *pcStack_20;
  int n;
  char *b_local;
  char *a_local;
  
  pcStack_20 = b;
  b_local = a;
  while( true ) {
    while ((int)*b_local - (int)*pcStack_20 != 0) {
      if (*b_local == '&') {
        b_local = b_local + 1;
      }
      else {
        if (*pcStack_20 != '&') {
          return (int)*b_local - (int)*pcStack_20;
        }
        pcStack_20 = pcStack_20 + 1;
      }
    }
    if (*b_local == '\0') break;
    b_local = b_local + 1;
    pcStack_20 = pcStack_20 + 1;
  }
  return 0;
}

Assistant:

static int compare(const char* a, const char* b) {
  for (;;) {
    int n = *a-*b;
    if (n) {
      if (*a == '&') a++;
      else if (*b == '&') b++;
      else return n;
    } else if (*a) {
      a++; b++;
    } else {
      return 0;
    }
  }
}